

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O1

BOOL Js::JavascriptExceptionOperators::GetCaller
               (JavascriptStackWalker *walker,JavascriptFunction **jsFunc)

{
  BOOL BVar1;
  uint uVar2;
  InterpreterStackFrame *pIVar3;
  ByteCodeReader *this;
  BOOL BVar4;
  
  BVar4 = 1;
  BVar1 = JavascriptStackWalker::GetCaller(walker,jsFunc,true);
  if (BVar1 == 0) {
    BVar4 = 0;
  }
  else {
    pIVar3 = JavascriptStackWalker::GetCurrentInterpreterFrame(walker);
    if (pIVar3 != (InterpreterStackFrame *)0x0) {
      this = (ByteCodeReader *)JavascriptStackWalker::GetCurrentInterpreterFrame(walker);
      uVar2 = ByteCodeReader::GetCurrentOffset(this);
      if (uVar2 == 0) {
        BVar1 = JavascriptStackWalker::GetCaller(walker,jsFunc,true);
        return BVar1;
      }
    }
  }
  return BVar4;
}

Assistant:

BOOL JavascriptExceptionOperators::GetCaller(JavascriptStackWalker& walker, _Out_opt_ JavascriptFunction*& jsFunc)
    {
        if (! walker.GetCaller(&jsFunc))
        {
            return FALSE;
        }

        if (! walker.GetCurrentInterpreterFrame() ||
             walker.GetCurrentInterpreterFrame()->GetReader()->GetCurrentOffset() > 0)
        {
            return TRUE;
        }

        return walker.GetCaller(&jsFunc);
    }